

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckOperator.cxx
# Opt level: O0

bool __thiscall
kws::Parser::FindOperator
          (Parser *this,char *op,uint before,uint after,unsigned_long maxSize,
          bool doNotCheckInsideParenthesis)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  value_type *__x;
  uint in_ECX;
  uint in_EDX;
  char *in_RSI;
  long in_RDI;
  undefined1 *in_R8;
  byte in_R9B;
  bool bVar4;
  char *val;
  size_t length;
  Error error;
  unsigned_long sum_1;
  string nextLine;
  string currentLine_1;
  uint aft;
  unsigned_long sum;
  string previousLine;
  string currentLine;
  long i;
  uint bef;
  bool showError;
  size_t operatorPos;
  long pos;
  bool hasErrors;
  undefined6 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  string *in_stack_fffffffffffffdd8;
  allocator *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  byte local_1f9;
  string *psVar5;
  undefined7 in_stack_fffffffffffffe10;
  byte in_stack_fffffffffffffe17;
  byte withComments;
  Parser *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe24;
  Parser *in_stack_fffffffffffffe28;
  string *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe5c;
  size_t in_stack_fffffffffffffe60;
  undefined6 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 uVar6;
  string local_160 [37];
  byte local_13b;
  byte local_13a;
  allocator local_139;
  string local_138 [37];
  byte local_113;
  byte local_112;
  allocator local_111;
  string local_110 [32];
  bool *local_f0;
  string local_e8 [32];
  string local_c8 [32];
  uint local_a8;
  int local_a4;
  _Alloc_hider *local_a0;
  string local_88 [32];
  string local_68 [32];
  string *local_48;
  uint local_40;
  byte local_39;
  string *local_38;
  undefined1 *local_30;
  byte local_22;
  byte local_21;
  undefined1 *local_20;
  uint local_18;
  uint local_14;
  char *local_10;
  
  local_21 = in_R9B & 1;
  local_22 = 0;
  local_30 = (undefined1 *)0x0;
  local_20 = in_R8;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_38 = (string *)std::__cxx11::string::find((char *)(in_RDI + 0x518),(ulong)in_RSI);
  do {
    if (local_38 == (string *)0xffffffffffffffff) {
      return (bool)((local_22 ^ 0xff) & 1);
    }
    local_39 = 1;
    local_40 = 0;
    local_48 = local_38;
    do {
      while( true ) {
        local_48 = (string *)((long)&local_48[-1].field_2 + 0xf);
        uVar6 = false;
        if (0 < (long)local_48) {
          pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
          in_stack_fffffffffffffe6e = true;
          uVar6 = in_stack_fffffffffffffe6e;
          if (*pcVar1 != ' ') {
            pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
            in_stack_fffffffffffffe6e = true;
            uVar6 = in_stack_fffffffffffffe6e;
            if (*pcVar1 != '\r') {
              pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
              in_stack_fffffffffffffe6e = *pcVar1 == '\n';
              uVar6 = in_stack_fffffffffffffe6e;
            }
          }
        }
        if ((bool)uVar6 == false) goto LAB_001b34c6;
        pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
        if ((*pcVar1 == '\r') ||
           (pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518), *pcVar1 == '\n'))
        break;
        local_40 = local_40 + 1;
      }
      in_stack_fffffffffffffe5c = 0;
      GetLineNumber((Parser *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                    (size_t)in_stack_fffffffffffffde0,
                    SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x38,0));
      GetLine_abi_cxx11_(in_stack_fffffffffffffe18,
                         CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
      in_stack_fffffffffffffe60 =
           GetLineNumber((Parser *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                         (size_t)in_stack_fffffffffffffde0,
                         SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x38,0));
      GetLine_abi_cxx11_(in_stack_fffffffffffffe18,
                         CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
      in_stack_fffffffffffffe50 = (string *)std::__cxx11::string::size();
      lVar3 = std::__cxx11::string::size();
      local_a0 = &in_stack_fffffffffffffe50->_M_dataplus + lVar3;
      if (local_20 < local_a0) {
        local_39 = 0;
        local_a4 = 5;
      }
      else {
        local_a4 = 0;
      }
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_68);
    } while (local_a4 == 0);
LAB_001b34c6:
    psVar5 = local_38;
    local_a8 = 0;
    sVar2 = strlen(local_10);
    local_48 = (string *)(&psVar5->_M_dataplus + sVar2);
    while( true ) {
      psVar5 = local_48;
      lVar3 = std::__cxx11::string::size();
      bVar4 = false;
      if ((long)psVar5 < lVar3) {
        pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
        bVar4 = true;
        if (*pcVar1 != ' ') {
          pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
          bVar4 = true;
          if (*pcVar1 != '\r') {
            pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
            bVar4 = *pcVar1 == '\n';
          }
        }
      }
      if (!bVar4) break;
      pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
      if ((*pcVar1 == '\r') ||
         (pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518), *pcVar1 == '\n')) {
        in_stack_fffffffffffffe24 = 0;
        GetLineNumber((Parser *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                      (size_t)in_stack_fffffffffffffde0,
                      SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x38,0));
        GetLine_abi_cxx11_(in_stack_fffffffffffffe18,
                           CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
        in_stack_fffffffffffffe28 =
             (Parser *)
             GetLineNumber((Parser *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                           (size_t)in_stack_fffffffffffffde0,
                           SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x38,0));
        GetLine_abi_cxx11_(in_stack_fffffffffffffe18,
                           CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
        in_stack_fffffffffffffe18 = (Parser *)std::__cxx11::string::size();
        lVar3 = std::__cxx11::string::size();
        local_f0 = in_stack_fffffffffffffe18->m_TestsDone + lVar3 + -0x30;
        if (local_20 < local_f0) {
          local_39 = 0;
          local_a4 = 7;
        }
        else {
          local_a4 = 0;
        }
        std::__cxx11::string::~string(local_e8);
        std::__cxx11::string::~string(local_c8);
        if (local_a4 != 0) break;
      }
      else {
        local_a8 = local_a8 + 1;
      }
      local_48 = (string *)((long)local_48 + 1);
    }
    if (((local_39 & 1) != 0) && ((local_40 != local_14 || (local_a8 != local_18)))) {
      psVar5 = local_38;
      lVar3 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e662d);
      local_112 = 0;
      local_113 = 0;
      local_13a = 0;
      local_13b = 0;
      withComments = 0;
      local_1f9 = withComments;
      if ((psVar5 != (string *)(lVar3 + 8)) && (local_1f9 = 0, (local_21 & 1) != 0)) {
        std::allocator<char>::allocator();
        local_112 = 1;
        std::__cxx11::string::string(local_110,"",&local_111);
        local_113 = 1;
        in_stack_fffffffffffffdef =
             IsBetweenCharsFast(in_stack_fffffffffffffe28,
                                (char)((uint)in_stack_fffffffffffffe24 >> 0x18),
                                (char)((uint)in_stack_fffffffffffffe24 >> 0x10),
                                (size_t)in_stack_fffffffffffffe18,(bool)withComments,psVar5);
        local_1f9 = 0;
        if (!(bool)in_stack_fffffffffffffdef) {
          in_stack_fffffffffffffde0 = &local_139;
          in_stack_fffffffffffffdd8 = local_38;
          std::allocator<char>::allocator();
          local_13a = 1;
          std::__cxx11::string::string(local_138,"",in_stack_fffffffffffffde0);
          local_13b = 1;
          in_stack_fffffffffffffdd7 =
               IsBetweenQuote((Parser *)
                              CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffe6e,
                                                      in_stack_fffffffffffffe68)),
                              in_stack_fffffffffffffe60,
                              SUB41((uint)in_stack_fffffffffffffe5c >> 0x18,0),
                              in_stack_fffffffffffffe50);
          local_1f9 = in_stack_fffffffffffffdd7 ^ 0xff;
        }
      }
      in_stack_fffffffffffffe17 = local_1f9;
      if ((local_13b & 1) != 0) {
        std::__cxx11::string::~string(local_138);
      }
      if ((local_13a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_139);
      }
      if ((local_113 & 1) != 0) {
        std::__cxx11::string::~string(local_110);
      }
      if ((local_112 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_111);
      }
      if ((local_1f9 & 1) != 0) {
        ErrorStruct::ErrorStruct((ErrorStruct *)0x1b39be);
        __x = (value_type *)
              GetLineNumber((Parser *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                            (size_t)in_stack_fffffffffffffde0,
                            SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x38,0));
        std::__cxx11::string::operator=(local_160,"Spaces around operator are wrong: ");
        std::__cxx11::string::operator+=(local_160,"before = ");
        pcVar1 = (char *)operator_new__(10);
        snprintf(pcVar1,10,"%d",(ulong)local_40);
        std::__cxx11::string::operator+=(local_160,pcVar1);
        std::__cxx11::string::operator+=(local_160," v.s ");
        snprintf(pcVar1,10,"%d",(ulong)local_14);
        std::__cxx11::string::operator+=(local_160,pcVar1);
        std::__cxx11::string::operator+=(local_160," ,after = ");
        snprintf(pcVar1,10,"%d",(ulong)local_a8);
        std::__cxx11::string::operator+=(local_160,pcVar1);
        std::__cxx11::string::operator+=(local_160," v.s ");
        snprintf(pcVar1,10,"%d",(ulong)local_18);
        std::__cxx11::string::operator+=(local_160,pcVar1);
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                  ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                   CONCAT17(in_stack_fffffffffffffdd7,CONCAT16(local_1f9,in_stack_fffffffffffffdd0))
                   ,__x);
        if (pcVar1 != (char *)0x0) {
          operator_delete__(pcVar1);
        }
        local_22 = 1;
        ErrorStruct::~ErrorStruct((ErrorStruct *)0x1b3bcb);
      }
    }
    local_30 = &local_38->field_0x1;
    local_38 = (string *)std::__cxx11::string::find((char *)(in_RDI + 0x518),(ulong)local_10);
  } while( true );
}

Assistant:

bool Parser::FindOperator(const char* op,unsigned int before, 
                          unsigned int after,
                          unsigned long maxSize,
                          bool doNotCheckInsideParenthesis
                          )
{
  bool hasErrors = false;
  long int pos = 0;
  size_t operatorPos = m_BufferNoComment.find(op,pos);
  while(operatorPos != std::string::npos) 
    {
    bool showError=true;
    // Check number of space before
    unsigned int bef = 0;
    long int i = static_cast<long int>(operatorPos)-1;
    while((i>0) && ((m_BufferNoComment[i] == ' ')
       || (m_BufferNoComment[i] == '\r')
       || (m_BufferNoComment[i] == '\n'))
       )
      {
      if((m_BufferNoComment[i] != '\r')
       && (m_BufferNoComment[i] != '\n'))
        {
        bef++;
        }
      else
        {
        // check if the sum of the two lines is higher than the maximum length
        std::string currentLine = this->GetLine(this->GetLineNumber(i,true)-1);
        std::string previousLine = this->GetLine(this->GetLineNumber(i,true));
        auto sum = static_cast<unsigned long>(currentLine.size() +
                                              previousLine.size());
        if(sum>maxSize)
          {
          showError = false;
          break;
          }
        }
      i--;
      }

    // Check number of space after
    unsigned int aft = 0;
    i = static_cast<long int>(operatorPos+strlen(op));
    while((i<(long int)m_BufferNoComment.size())
           && ((m_BufferNoComment[i] == ' ')
           || (m_BufferNoComment[i] == '\r')
           || (m_BufferNoComment[i] == '\n')
           )
           )
      {
      if((m_BufferNoComment[i] == '\r')
        || (m_BufferNoComment[i] == '\n'))
        {
        // check if the sum of the two lines is higher than the maximum length
        std::string currentLine = this->GetLine(this->GetLineNumber(i,true)-1);
        std::string nextLine = this->GetLine(this->GetLineNumber(i,true));
        auto sum =
            static_cast<unsigned long>(currentLine.size() + nextLine.size());
        if(sum>maxSize)
          {
          showError = false;
          break;
          }
        }
      else
        {
        aft++;
        }
      i++;
      }
   
    if(showError  && (bef != before || aft != after))
      {
      // we make sure that the keyword operator is not defined right before
      if(operatorPos != m_BufferNoComment.find("operator",operatorPos-11)+8
        && (doNotCheckInsideParenthesis && !this->IsBetweenCharsFast('(',')',operatorPos,false)
        && !this->IsBetweenQuote(operatorPos,false)
        ) 
        )
        {
        Error error;
        error.line = this->GetLineNumber(operatorPos,true);
        error.line2 = error.line;
        error.number = OPERATOR;
        error.description = "Spaces around operator are wrong: ";
        error.description += "before = ";
        constexpr size_t length = 10;
        char* val = new char[length];
        snprintf(val,length,"%d",bef);
        error.description += val;
        error.description += " v.s ";
        snprintf(val,length,"%d",before);
        error.description += val;
        error.description += " ,after = ";
        snprintf(val,length,"%d",aft);
        error.description += val;
        error.description += " v.s ";
        snprintf(val,length,"%d",after);
        error.description += val;
        m_ErrorList.push_back(error);
        delete [] val;
        hasErrors = true;
        }
      }
    pos = static_cast<long int>(operatorPos)+1;
    operatorPos = m_BufferNoComment.find(op,operatorPos+1);  
    }
  return !hasErrors;
}